

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O2

SRes Lzma2Decode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte prop,
                ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAlloc *alloc)

{
  SizeT dicLimit;
  SizeT SVar1;
  SRes SVar2;
  CLzma2Dec local_d8;
  
  dicLimit = *destLen;
  SVar1 = *srcLen;
  *srcLen = 0;
  *destLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  local_d8.decoder.probs = (UInt16 *)0x0;
  local_d8.decoder.dic = (Byte *)0x0;
  SVar2 = Lzma2Dec_AllocateProbs(&local_d8,prop,alloc);
  if (SVar2 == 0) {
    local_d8.decoder.dic = dest;
    local_d8.decoder.dicBufSize = dicLimit;
    Lzma2Dec_Init(&local_d8);
    *srcLen = SVar1;
    SVar2 = Lzma2Dec_DecodeToDic(&local_d8,dicLimit,src,srcLen,finishMode,status);
    *destLen = local_d8.decoder.dicPos;
    if (SVar2 == 0) {
      SVar2 = 6;
      if (*status != LZMA_STATUS_NEEDS_MORE_INPUT) {
        SVar2 = 0;
      }
    }
    LzmaDec_FreeProbs(&local_d8.decoder,alloc);
  }
  return SVar2;
}

Assistant:

SRes Lzma2Decode(Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen,
    Byte prop, ELzmaFinishMode finishMode, ELzmaStatus *status, ISzAlloc *alloc)
{
  CLzma2Dec p;
  SRes res;
  SizeT outSize = *destLen, inSize = *srcLen;
  *destLen = *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  Lzma2Dec_Construct(&p);
  RINOK(Lzma2Dec_AllocateProbs(&p, prop, alloc));
  p.decoder.dic = dest;
  p.decoder.dicBufSize = outSize;
  Lzma2Dec_Init(&p);
  *srcLen = inSize;
  res = Lzma2Dec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);
  *destLen = p.decoder.dicPos;
  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;
  Lzma2Dec_FreeProbs(&p, alloc);
  return res;
}